

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

void __thiscall CTcPrsMem::alloc_block(CTcPrsMem *this)

{
  tcprsmem_blk_t *ptVar1;
  CTcPrsMem *pCVar2;
  char *pcVar3;
  
  ptVar1 = (tcprsmem_blk_t *)malloc(0xfdf7);
  if (ptVar1 != (tcprsmem_blk_t *)0x0) {
    ptVar1->next_ = (tcprsmem_blk_t *)0x0;
    pCVar2 = (CTcPrsMem *)this->tail_;
    if ((CTcPrsMem *)this->tail_ == (CTcPrsMem *)0x0) {
      pCVar2 = this;
    }
    pCVar2->head_ = ptVar1;
    this->tail_ = ptVar1;
    pcVar3 = (char *)((ulong)&ptVar1->field_0xf & 0xfffffffffffffff8);
    this->free_ptr_ = pcVar3;
    this->rem_ = (long)ptVar1 + (0xfdf0 - (long)pcVar3);
    return;
  }
  err_throw(0x2afa);
}

Assistant:

void CTcPrsMem::alloc_block()
{
    tcprsmem_blk_t *blk;

    /* 
     *   block size - pick a size that's large enough that we won't be
     *   unduly inefficient (in terms of having tons of blocks), but still
     *   friendly to 16-bit platforms (i.e., under 64k) 
     */
    const size_t BLOCK_SIZE = 65000;

    /* allocate space for the block */
    blk = (tcprsmem_blk_t *)t3malloc(sizeof(tcprsmem_blk_t) + BLOCK_SIZE - 1);

    /* if that failed, throw an error */
    if (blk == 0)
        err_throw(TCERR_NO_MEM_PRS_TREE);

    /* link in the block at the end of our list */
    blk->next_ = 0;
    if (tail_ != 0)
        tail_->next_ = blk;
    else
        head_ = blk;

    /* the block is now the last block in the list */
    tail_ = blk;

    /* 
     *   Set up to allocate out of our block.  Make sure the free pointer
     *   starts out on a worst-case alignment boundary; normally, the C++
     *   compiler will properly align our "buf_" structure member on a
     *   worst-case boundary, so this calculation won't actually change
     *   anything, but this will help ensure portability even to weird
     *   compilers.  
     */
    free_ptr_ = (char *)osrndpt((unsigned char *)blk->buf_);

    /* 
     *   get the amount of space remaining in the block (in the unlikely
     *   event that worst-case alignment actually moved the free pointer
     *   above the start of the buffer, we'll have lost a little space in
     *   the buffer for the alignment offset) 
     */
    rem_ = BLOCK_SIZE - (free_ptr_ - blk->buf_);
}